

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_defaultConstructorConstRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::
TestBody(optTyped_defaultConstructorConstRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
         *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_130;
  Message local_128;
  storage_type local_120;
  long local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  Message local_f8 [2];
  bad_optional_access *anon_var_0;
  opt<long,_mp::opt_null_value_policy<long,__1L>_> local_e0;
  byte local_d1;
  char *pcStack_d0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertHelper local_a8;
  Message local_a0;
  opt<long,_mp::opt_null_value_policy<long,__1L>_> local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_58 [3];
  Message local_40;
  storage_type local_38;
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 make;
  optTyped_defaultConstructorConstRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
  *this_local;
  
  local_38 = (storage_type)
             TestBody::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = mp::opt::operator_cast_to_bool((opt *)&local_38);
  local_29 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_28,&local_29,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_28,(AssertionResult *)0x209ab6,
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x125,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_98.storage_ =
       (storage_type)
       TestBody::anon_class_1_0_00000001::operator()
                 ((anon_class_1_0_00000001 *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::has_value(&local_98);
  local_89 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_msg,(internal *)local_88,(AssertionResult *)"make().has_value()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x126,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_msg);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff30,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff30);
  if (bVar1) {
    local_d1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_e0.storage_ =
           (storage_type)
           TestBody::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)((long)&gtest_ar_.message_.ptr_ + 7));
      mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::value(&local_e0);
    }
    if ((local_d1 & 1) != 0) goto LAB_0019da65;
    pcStack_d0 = 
    "Expected: make().value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_f8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x127,pcStack_d0);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_f8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::Message::~Message(local_f8);
LAB_0019da65:
  local_120 = (storage_type)
              TestBody::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&gtest_ar_.message_.ptr_ + 7));
  local_118 = mp::opt<long,mp::opt_null_value_policy<long,-1l>>::value_or<long_const&>
                        ((opt<long,mp::opt_null_value_policy<long,_1l>> *)&local_120,
                         &(this->
                          super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).
                          value_2);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_110,"this->value_2","make().value_or(this->value_2)",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_2,
             &local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x128,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  return;
}

Assistant:

TYPED_TEST(optTyped, defaultConstructorConstRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = []() -> const opt_type { return opt_type{}; };
  EXPECT_FALSE(make());
  EXPECT_FALSE(make().has_value());
  EXPECT_THROW(make().value(), bad_optional_access);
  EXPECT_EQ(this->value_2, make().value_or(this->value_2));
}